

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastShiftLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                       Vec_Int_t *vRes)

{
  uint uVar1;
  uint uVar2;
  int iLit0;
  ulong uVar3;
  
  uVar2 = nNum;
  if (1 < (uint)nNum) {
    uVar2 = nNum - 1;
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar2 = (uVar1 ^ 0xffffffe0) + 0x21;
    }
  }
  if ((int)uVar2 < nShift) {
    iLit0 = pShift[uVar2];
    if ((int)(uVar2 + 1) < nShift) {
      uVar3 = (ulong)(uVar2 + 1);
      do {
        iLit0 = Gia_ManHashOr(pNew,iLit0,pShift[uVar3]);
        uVar3 = uVar3 + 1;
      } while ((uint)nShift != uVar3);
    }
    pShift[uVar2] = iLit0;
    nShift = uVar2 + 1;
  }
  Wlc_BlastShiftLeftInt(pNew,pNum,nNum,pShift,nShift,fSticky,vRes);
  return;
}

Assistant:

void Wlc_BlastShiftLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int nShiftMax = Abc_Base2Log(nNum);
    if ( nShiftMax < nShift )
    {
        int i, iRes = pShift[nShiftMax];
        for ( i = nShiftMax + 1; i < nShift; i++ )
            iRes = Gia_ManHashOr( pNew, iRes, pShift[i] );
        pShift[nShiftMax++] = iRes;
    }
    else 
        nShiftMax = nShift;
    Wlc_BlastShiftLeftInt( pNew, pNum, nNum, pShift, nShiftMax, fSticky, vRes );
}